

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O3

string * __thiscall
SchemaConverter::_generate_constant_rule
          (string *__return_storage_ptr__,SchemaConverter *this,json *value)

{
  string_t local_30;
  
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(&local_30,value,-1,' ',false,strict);
  format_literal(__return_storage_ptr__,(string *)local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _generate_constant_rule(const json & value) {
        return format_literal(value.dump());
    }